

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcommon.hpp
# Opt level: O1

void __thiscall message::message(message *this,string *body)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  long lVar5;
  
  this->id_ = 0;
  paVar1 = &(this->body_).field_2;
  (this->body_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (body->_M_dataplus)._M_p;
  paVar2 = &body->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&body->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->body_).field_2 + 8) = uVar4;
  }
  else {
    (this->body_)._M_dataplus._M_p = pcVar3;
    (this->body_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->body_)._M_string_length = body->_M_string_length;
  (body->_M_dataplus)._M_p = (pointer)paVar2;
  body->_M_string_length = 0;
  (body->field_2)._M_local_buf[0] = '\0';
  LOCK();
  UNLOCK();
  lVar5 = (anonymous_namespace)::next_id + 1;
  this->id_ = (anonymous_namespace)::next_id;
  (anonymous_namespace)::next_id = lVar5;
  return;
}

Assistant:

std::uint64_t id() const {
        return id_;
    }